

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O3

void upgrade_v1_3_2(path *root,json *dbjson)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  reference pvVar4;
  reference this;
  string_view path;
  string_view filename_00;
  string filename;
  json iterjson;
  iteration_proxy_internal iter;
  iteration_proxy_internal __end1;
  json_value local_f0;
  undefined1 local_e8 [8];
  json_value local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b8;
  pointer p_Stack_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pointer p_Stack_70;
  pointer local_68;
  pointer local_60;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_58;
  undefined8 local_38;
  
  local_e8[0] = null;
  local_e0.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[6],_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_e8,(char (*) [6])"1.5.0");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)dbjson,"version");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_e8[0];
  jVar2 = pvVar4->m_value;
  (pvVar4->m_value).object = (object_t *)local_e0;
  local_e8[0] = vVar1;
  local_e0 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_e8 + 8),vVar1);
  local_b8.m_object =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)dbjson,"iterators");
  vVar1 = (local_b8.m_object)->m_type;
  if (vVar1 == array) {
    local_b8.m_it.array_iterator._M_current =
         ((((local_b8.m_object)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_58.m_it.array_iterator._M_current =
         ((((local_b8.m_object)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (vVar1 == object) {
    local_b8.m_it.object_iterator._M_node =
         ((((local_b8.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
         _M_left;
    local_58.m_it.array_iterator._M_current = (pointer)0x0;
    local_b8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_58.m_it.object_iterator._M_node =
         &((((local_b8.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_b8.m_it.primitive_iterator.m_it._1_7_ = 0;
    local_b8.m_it.primitive_iterator.m_it._0_1_ = vVar1 == null;
    local_b8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.primitive_iterator.m_it = 1;
    local_58.m_it.array_iterator._M_current = (pointer)0x0;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  }
  p_Stack_98 = (pointer)0x0;
  local_38 = 0;
  local_58.m_object = local_b8.m_object;
  while (bVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==(&local_b8,&local_58), !bVar3) {
    local_80._M_allocated_capacity = (size_type)local_b8.m_object;
    local_68 = (pointer)local_b8.m_it.primitive_iterator.m_it;
    local_80._8_8_ = local_b8.m_it.object_iterator._M_node;
    p_Stack_70 = (pointer)local_b8.m_it.array_iterator._M_current;
    local_60 = p_Stack_98;
    this = nlohmann::detail::
           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_80);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_d8,this);
    path._M_str = (char *)local_d8._M_string_length;
    path._M_len = (size_t)root;
    read_json((path *)local_90,path);
    local_f0.number_integer = time((time_t *)0x0);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_90,"last_read_timestamp");
    vVar1 = pvVar4->m_type;
    pvVar4->m_type = number_integer;
    jVar2 = pvVar4->m_value;
    (pvVar4->m_value).number_integer = (number_integer_t)local_f0;
    local_f0 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_f0.boolean,vVar1);
    filename_00._M_str = local_d8._M_dataplus._M_p;
    filename_00._M_len = local_d8._M_string_length;
    save_json(root,filename_00,(json *)local_90);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_90 + 8),local_90[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((local_b8.m_object)->m_type == array) {
      local_b8.m_it.array_iterator._M_current = local_b8.m_it.array_iterator._M_current + 1;
    }
    else if ((local_b8.m_object)->m_type == object) {
      local_b8.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_b8.m_it.object_iterator._M_node);
    }
    else {
      local_b8.m_it.primitive_iterator.m_it = local_b8.m_it.primitive_iterator.m_it + 1;
    }
    p_Stack_98 = (pointer)((long)&(p_Stack_98->super_path)._M_pathname._M_dataplus._M_p + 1);
  }
  return;
}

Assistant:

void upgrade_v1_3_2(const fs::path &root, json *dbjson) {
    json &db = *dbjson;
    db["version"] = "1.5.0";
    for (const auto iter : db["iterators"].items()) {
        std::string filename{iter.value()};
        json iterjson = read_json(root, filename);
        iterjson["last_read_timestamp"] = std::time(nullptr);
        save_json(root, filename, iterjson);
    }
}